

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O2

void b2CollidePolygons(cbtManifoldResult *manifold,cbtBox2dShape *polyA,cbtTransform *xfA,
                      cbtBox2dShape *polyB,cbtTransform *xfB)

{
  cbtVector3 *pcVar1;
  cbtScalar acVar2 [4];
  undefined8 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  cbtTransform *pcVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  int iVar10;
  ulong uVar11;
  cbtScalar *pcVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int *piVar16;
  cbtBox2dShape *pcVar17;
  cbtVector3 *pcVar18;
  ClipVertex *vOut;
  cbtScalar cVar19;
  cbtScalar cVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar31 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar22 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  cbtVector3 cVar48;
  cbtVector3 cVar49;
  int edgeB;
  int edgeA;
  cbtVector3 sideNormal;
  ClipVertex incidentEdge [2];
  cbtScalar local_1c8;
  int local_1b0 [2];
  cbtVector3 local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  cbtVector3 local_178;
  ClipVertex local_168;
  cbtScalar local_154 [4];
  ClipVertex local_138;
  cbtScalar local_124 [4];
  cbtVector3 local_108;
  cbtVector3 local_f8;
  cbtMatrix3x3 local_e8;
  cbtTransform local_b8;
  cbtTransform local_78;
  undefined1 auVar42 [56];
  
  local_1b0[1] = 0;
  cVar19 = FindMaxSeparation(local_1b0 + 1,polyA,xfA,polyB,xfB);
  if (cVar19 <= 0.0) {
    local_1b0[0] = 0;
    cVar20 = FindMaxSeparation(local_1b0,polyB,xfB,polyA,xfA);
    if (cVar20 <= 0.0) {
      auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f7ae148),0),ZEXT416((uint)cVar19),
                                ZEXT416(0x3a83126f));
      auVar42 = ZEXT856(auVar21._8_8_);
      fVar32 = auVar21._0_4_;
      pcVar17 = polyB;
      pcVar6 = xfA;
      if (cVar20 <= fVar32) {
        pcVar17 = polyA;
        pcVar6 = xfB;
        xfB = xfA;
        polyA = polyB;
      }
      piVar16 = local_1b0;
      if (cVar20 <= fVar32) {
        piVar16 = local_1b0 + 1;
      }
      local_78.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(xfB->m_basis).m_el[0].m_floats;
      local_78.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((xfB->m_basis).m_el[0].m_floats + 2)
      ;
      local_78.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(xfB->m_basis).m_el[1].m_floats;
      local_78.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((xfB->m_basis).m_el[1].m_floats + 2)
      ;
      local_78.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(xfB->m_basis).m_el[2].m_floats;
      local_78.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((xfB->m_basis).m_el[2].m_floats + 2)
      ;
      local_78.m_origin.m_floats._0_8_ = *(undefined8 *)(xfB->m_origin).m_floats;
      local_78.m_origin.m_floats._8_8_ = *(undefined8 *)((xfB->m_origin).m_floats + 2);
      local_b8.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pcVar6->m_basis).m_el[0].m_floats;
      local_b8.m_basis.m_el[0].m_floats._8_8_ =
           *(undefined8 *)((pcVar6->m_basis).m_el[0].m_floats + 2);
      local_b8.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pcVar6->m_basis).m_el[1].m_floats;
      local_b8.m_basis.m_el[1].m_floats._8_8_ =
           *(undefined8 *)((pcVar6->m_basis).m_el[1].m_floats + 2);
      local_b8.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pcVar6->m_basis).m_el[2].m_floats;
      local_b8.m_basis.m_el[2].m_floats._8_8_ =
           *(undefined8 *)((pcVar6->m_basis).m_el[2].m_floats + 2);
      uVar11 = *(ulong *)((pcVar6->m_origin).m_floats + 2);
      auVar31 = ZEXT856(uVar11);
      local_b8.m_origin.m_floats._0_8_ = *(undefined8 *)(pcVar6->m_origin).m_floats;
      local_b8.m_origin.m_floats[2] = (cbtScalar)(int)uVar11;
      local_b8.m_origin.m_floats[3] = (cbtScalar)(int)(uVar11 >> 0x20);
      iVar10 = *piVar16;
      cbtMatrix3x3::transpose(&local_e8,&local_b8.m_basis);
      cVar48 = operator*(&local_78.m_basis,pcVar17->m_normals + iVar10);
      auVar35._0_8_ = cVar48.m_floats._8_8_;
      auVar35._8_56_ = auVar42;
      auVar45._0_8_ = cVar48.m_floats._0_8_;
      auVar45._8_56_ = auVar31;
      local_168.v.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar45._0_16_,auVar35._0_16_);
      auVar31 = ZEXT856(local_168.v.m_floats._8_8_);
      cVar48 = operator*(&local_e8,&local_168.v);
      auVar36._0_8_ = cVar48.m_floats._8_8_;
      auVar36._8_56_ = auVar42;
      auVar47._0_8_ = cVar48.m_floats._0_8_;
      auVar47._8_56_ = auVar31;
      auVar45 = ZEXT464(0x5d5e0b6b);
      auVar21 = vmovshdup_avx(auVar47._0_16_);
      pcVar12 = polyA->m_normals[0].m_floats + 2;
      uVar11 = 0;
      for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * pcVar12[-1])),auVar47._0_16_,
                                  ZEXT416((uint)((cbtVector3 *)(pcVar12 + -2))->m_floats[0]));
        auVar33 = vfmadd231ss_fma(auVar22,auVar36._0_16_,ZEXT416((uint)*pcVar12));
        fVar44 = auVar45._0_4_;
        auVar22 = vminss_avx(auVar33,auVar45._0_16_);
        auVar45 = ZEXT1664(auVar22);
        if (auVar33._0_4_ < fVar44) {
          uVar11 = uVar13 & 0xffffffff;
        }
        pcVar12 = pcVar12 + 4;
      }
      iVar4 = (int)uVar11;
      iVar14 = 0;
      if (iVar4 < 3) {
        iVar14 = iVar4 + 1;
      }
      cVar48 = cbtTransform::operator()(&local_b8,polyA->m_vertices + iVar4);
      auVar37._0_8_ = cVar48.m_floats._8_8_;
      auVar37._8_56_ = auVar42;
      auVar26._0_8_ = cVar48.m_floats._0_8_;
      auVar26._8_56_ = auVar31;
      local_e8.m_el[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar26._0_16_,auVar37._0_16_);
      auVar31 = ZEXT856(local_e8.m_el[0].m_floats._8_8_);
      cVar48 = cbtTransform::operator()(&local_b8,polyA->m_vertices + iVar14);
      auVar38._0_8_ = cVar48.m_floats._8_8_;
      auVar38._8_56_ = auVar42;
      auVar27._0_8_ = cVar48.m_floats._0_8_;
      auVar27._8_56_ = auVar31;
      pcVar1 = pcVar17->m_vertices + (long)iVar10 + 1;
      local_e8.m_el._20_16_ = vmovlhps_avx(auVar27._0_16_,auVar38._0_16_);
      pcVar18 = pcVar17->m_vertices;
      if (iVar10 < 3) {
        pcVar18 = pcVar1;
      }
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)pcVar1[-1].m_floats;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)pcVar18->m_floats;
      auVar21 = vsubps_avx(auVar21,auVar22);
      local_108.m_floats[2] = (cbtScalar)*(undefined8 *)(pcVar18->m_floats + 2);
      local_f8.m_floats[2] = (cbtScalar)*(undefined8 *)(pcVar1[-1].m_floats + 2);
      auVar31 = (undefined1  [56])0x0;
      local_168.v.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar21,ZEXT416((uint)(local_108.m_floats[2] - local_f8.m_floats[2])),0x28)
      ;
      auVar42 = ZEXT856(local_168.v.m_floats._8_8_);
      local_108.m_floats = *&pcVar18->m_floats;
      local_f8.m_floats = *&pcVar1[-1].m_floats;
      cVar48 = operator*(&local_78.m_basis,&local_168.v);
      auVar39._0_8_ = cVar48.m_floats._8_8_;
      auVar39._8_56_ = auVar31;
      auVar28._0_8_ = cVar48.m_floats._0_8_;
      auVar28._8_56_ = auVar42;
      local_178.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar28._0_16_,auVar39._0_16_);
      cbtVector3::normalize(&local_178);
      local_198 = ZEXT416((uint)local_178.m_floats[0]);
      cVar19 = local_178.m_floats[1];
      auVar42 = (undefined1  [56])0x0;
      auVar22 = ZEXT416((uint)local_178.m_floats[1]);
      cVar48 = cbtTransform::operator()(&local_78,&local_f8);
      auVar40._0_8_ = cVar48.m_floats._8_8_;
      auVar40._8_56_ = auVar31;
      auVar29._0_8_ = cVar48.m_floats._0_8_;
      auVar29._8_56_ = auVar42;
      local_f8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar29._0_16_,auVar40._0_16_);
      auVar42 = ZEXT856(local_f8.m_floats._8_8_);
      cVar49 = cbtTransform::operator()(&local_78,&local_108);
      cVar48.m_floats = local_178.m_floats;
      auVar41._0_8_ = cVar49.m_floats._8_8_;
      auVar41._8_56_ = auVar31;
      auVar30._0_8_ = cVar49.m_floats._0_8_;
      auVar30._8_56_ = auVar42;
      local_188._8_8_ = 0;
      local_188._0_4_ = local_178.m_floats[0];
      local_188._4_4_ = local_178.m_floats[1];
      cVar8 = local_f8.m_floats[1];
      local_108.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar30._0_16_,auVar41._0_16_);
      cVar7 = local_f8.m_floats[0];
      cVar9 = local_f8.m_floats[2];
      local_178.m_floats[2] = cVar48.m_floats[2];
      local_168.v.m_floats = (cbtScalar  [4])(ZEXT816(0) << 0x20);
      auVar21 = vmovshdup_avx(local_188);
      auVar46 = ZEXT416((uint)local_178.m_floats[2]);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_f8.m_floats[1] * auVar21._0_4_)),local_188,
                                ZEXT416((uint)local_f8.m_floats[0]));
      auVar21 = vfmadd231ss_fma(auVar21,auVar46,ZEXT416((uint)local_f8.m_floats[2]));
      auVar33._0_8_ = local_178.m_floats._0_8_ ^ 0x8000000080000000;
      auVar33._8_4_ = 0x80000000;
      auVar33._12_4_ = 0x80000000;
      auVar43._0_4_ = -local_178.m_floats[2];
      auVar43._4_4_ = 0x80000000;
      auVar43._8_4_ = 0x80000000;
      auVar43._12_4_ = 0x80000000;
      local_1a8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar33,auVar43,0x28);
      local_178.m_floats = cVar48.m_floats;
      local_154 = local_168.v.m_floats;
      local_138.v.m_floats = local_168.v.m_floats;
      local_124 = local_168.v.m_floats;
      iVar10 = ClipSegmentToLine(&local_168,(ClipVertex *)&local_e8,&local_1a8,-auVar21._0_4_);
      if (1 < iVar10) {
        vOut = &local_138;
        auVar23._0_4_ = local_188._0_4_ * cVar49.m_floats[0];
        auVar23._4_4_ = local_188._4_4_ * cVar49.m_floats[1];
        auVar23._8_4_ = local_188._8_4_ * auVar42._0_4_;
        auVar23._12_4_ = local_188._12_4_ * auVar42._4_4_;
        auVar21 = vmovshdup_avx(auVar23);
        auVar21 = vfmadd231ss_fma(auVar21,auVar30._0_16_,local_188);
        local_1c8 = cVar49.m_floats[2];
        auVar21 = vfmadd231ss_fma(auVar21,auVar46,ZEXT416((uint)local_1c8));
        iVar10 = ClipSegmentToLine(vOut,&local_168,&local_178,auVar21._0_4_);
        if (1 < iVar10) {
          auVar46._0_8_ = local_198._0_8_ ^ 0x8000000080000000;
          auVar46._8_4_ = local_198._8_4_ ^ 0x80000000;
          auVar46._12_4_ = local_198._12_4_ ^ 0x80000000;
          auVar21 = vfmsub213ss_fma(ZEXT416((uint)cVar7),auVar22,
                                    ZEXT416((uint)(local_198._0_4_ * cVar8)));
          if (cVar20 <= fVar32) {
            auVar33 = vinsertps_avx(auVar22,auVar46,0x10);
          }
          else {
            auVar24._0_8_ = (ulong)(uint)cVar19 ^ 0x8000000080000000;
            auVar24._8_4_ = 0x80000000;
            auVar24._12_4_ = 0x80000000;
            auVar33 = vinsertps_avx(auVar24,local_198,0x1c);
          }
          uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar32),ZEXT416((uint)cVar20),5);
          auVar21 = vfmadd132ss_fma(ZEXT816(0) << 0x40,auVar21,ZEXT416((uint)cVar9));
          auVar47 = ZEXT1664(auVar21);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
          auVar25._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
          auVar25._8_4_ = auVar33._8_4_ ^ 0x80000000;
          auVar25._12_4_ = auVar33._12_4_ ^ 0x80000000;
          lVar15 = 0;
          auVar34._4_12_ = SUB1612(auVar5 << 0x40,4);
          auVar34._0_4_ = (uint)((byte)uVar3 & 1) * -0x80000000;
          acVar2 = (cbtScalar  [4])vmovlhps_avx(auVar25,auVar34);
          auVar45 = ZEXT464(0) << 0x20;
          iVar10 = b2_maxManifoldPoints;
          for (; lVar15 < iVar10; lVar15 = lVar15 + 1) {
            auVar33 = vfmadd231ss_fma(ZEXT416((uint)((float)auVar46._0_8_ * (vOut->v).m_floats[1])),
                                      auVar22,ZEXT416((uint)(vOut->v).m_floats[0]));
            auVar33 = vfmadd231ss_fma(auVar33,auVar45._0_16_,ZEXT416((uint)(vOut->v).m_floats[2]));
            if (auVar33._0_4_ - auVar47._0_4_ <= 0.0) {
              local_1a8.m_floats = acVar2;
              (*(manifold->super_Result)._vptr_Result[4])(manifold,&local_1a8,vOut);
              auVar47 = ZEXT464(auVar21._0_4_);
              auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
              iVar10 = b2_maxManifoldPoints;
            }
            vOut = vOut + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void b2CollidePolygons(cbtManifoldResult* manifold,
					   const cbtBox2dShape* polyA, const cbtTransform& xfA,
					   const cbtBox2dShape* polyB, const cbtTransform& xfB)
{
	int edgeA = 0;
	cbtScalar separationA = FindMaxSeparation(&edgeA, polyA, xfA, polyB, xfB);
	if (separationA > 0.0f)
		return;

	int edgeB = 0;
	cbtScalar separationB = FindMaxSeparation(&edgeB, polyB, xfB, polyA, xfA);
	if (separationB > 0.0f)
		return;

	const cbtBox2dShape* poly1;  // reference poly
	const cbtBox2dShape* poly2;  // incident poly
	cbtTransform xf1, xf2;
	int edge1;  // reference edge
	unsigned char flip;
	const cbtScalar k_relativeTol = 0.98f;
	const cbtScalar k_absoluteTol = 0.001f;

	// TODO_ERIN use "radius" of poly for absolute tolerance.
	if (separationB > k_relativeTol * separationA + k_absoluteTol)
	{
		poly1 = polyB;
		poly2 = polyA;
		xf1 = xfB;
		xf2 = xfA;
		edge1 = edgeB;
		flip = 1;
	}
	else
	{
		poly1 = polyA;
		poly2 = polyB;
		xf1 = xfA;
		xf2 = xfB;
		edge1 = edgeA;
		flip = 0;
	}

	ClipVertex incidentEdge[2];
	FindIncidentEdge(incidentEdge, poly1, xf1, edge1, poly2, xf2);

	int count1 = poly1->getVertexCount();
	const cbtVector3* vertices1 = poly1->getVertices();

	cbtVector3 v11 = vertices1[edge1];
	cbtVector3 v12 = edge1 + 1 < count1 ? vertices1[edge1 + 1] : vertices1[0];

	//cbtVector3 dv = v12 - v11;
	cbtVector3 sideNormal = b2Mul(xf1.getBasis(), v12 - v11);
	sideNormal.normalize();
	cbtVector3 frontNormal = cbtCrossS(sideNormal, 1.0f);

	v11 = b2Mul(xf1, v11);
	v12 = b2Mul(xf1, v12);

	cbtScalar frontOffset = b2Dot(frontNormal, v11);
	cbtScalar sideOffset1 = -b2Dot(sideNormal, v11);
	cbtScalar sideOffset2 = b2Dot(sideNormal, v12);

	// Clip incident edge against extruded edge1 side edges.
	ClipVertex clipPoints1[2];
	clipPoints1[0].v.setValue(0, 0, 0);
	clipPoints1[1].v.setValue(0, 0, 0);

	ClipVertex clipPoints2[2];
	clipPoints2[0].v.setValue(0, 0, 0);
	clipPoints2[1].v.setValue(0, 0, 0);

	int np;

	// Clip to box side 1
	np = ClipSegmentToLine(clipPoints1, incidentEdge, -sideNormal, sideOffset1);

	if (np < 2)
		return;

	// Clip to negative box side 1
	np = ClipSegmentToLine(clipPoints2, clipPoints1, sideNormal, sideOffset2);

	if (np < 2)
	{
		return;
	}

	// Now clipPoints2 contains the clipped points.
	cbtVector3 manifoldNormal = flip ? -frontNormal : frontNormal;

	int pointCount = 0;
	for (int i = 0; i < b2_maxManifoldPoints; ++i)
	{
		cbtScalar separation = b2Dot(frontNormal, clipPoints2[i].v) - frontOffset;

		if (separation <= 0.0f)
		{
			//b2ManifoldPoint* cp = manifold->points + pointCount;
			//cbtScalar separation = separation;
			//cp->localPoint1 = b2MulT(xfA, clipPoints2[i].v);
			//cp->localPoint2 = b2MulT(xfB, clipPoints2[i].v);

			manifold->addContactPoint(-manifoldNormal, clipPoints2[i].v, separation);

			//			cp->id = clipPoints2[i].id;
			//			cp->id.features.flip = flip;
			++pointCount;
		}
	}

	//	manifold->pointCount = pointCount;}
}